

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsReport.cpp
# Opt level: O0

void __thiscall KDReports::Report::setHeaderLocation(Report *this,HeaderLocations hl,Header *header)

{
  pointer pRVar1;
  Int local_24;
  Header *pHStack_20;
  HeaderLocations loc;
  Header *header_local;
  Report *this_local;
  HeaderLocations hl_local;
  
  pHStack_20 = header;
  this_local._4_4_ = hl.i;
  pRVar1 = std::unique_ptr<KDReports::ReportPrivate,_std::default_delete<KDReports::ReportPrivate>_>
           ::operator->(&this->d);
  local_24 = (Int)HeaderMap::headerLocation(&pRVar1->m_headers,pHStack_20);
  pRVar1 = std::unique_ptr<KDReports::ReportPrivate,_std::default_delete<KDReports::ReportPrivate>_>
           ::operator->(&this->d);
  QMap<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*>::remove
            (&(pRVar1->m_headers).super_QMap<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*>
             ,(char *)&local_24);
  pRVar1 = std::unique_ptr<KDReports::ReportPrivate,_std::default_delete<KDReports::ReportPrivate>_>
           ::operator->(&this->d);
  QMap<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*>::insert
            (&(pRVar1->m_headers).super_QMap<QFlags<KDReports::HeaderLocation>,_KDReports::Header_*>
             ,(QFlags<KDReports::HeaderLocation> *)((long)&this_local + 4),&stack0xffffffffffffffe0)
  ;
  return;
}

Assistant:

void KDReports::Report::setHeaderLocation(HeaderLocations hl, Header *header)
{
    // Remove old entry for this header
    HeaderLocations loc = d->m_headers.headerLocation(header);
    d->m_headers.remove(loc);
    d->m_headers.insert(hl, header);
}